

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O0

void rollback_to_zero_test(bool multi_kv)

{
  fdb_status fVar1;
  size_t sVar2;
  char *pcVar3;
  void *pvVar4;
  fdb_doc *in_stack_fffffffffffff988;
  fdb_file_handle *in_stack_fffffffffffff990;
  fdb_doc **in_stack_fffffffffffff998;
  size_t in_stack_fffffffffffff9b0;
  fdb_kvs_handle *local_5d8 [5];
  char *local_5b0;
  size_t local_5a8;
  char *local_5a0;
  size_t local_598;
  char *local_590;
  undefined1 *local_588;
  char *local_580;
  size_t local_578;
  char *local_570;
  size_t local_568;
  char *local_560;
  int local_554;
  undefined1 *in_stack_fffffffffffffab0;
  fdb_kvs_handle **in_stack_fffffffffffffab8;
  fdb_kvs_info *in_stack_fffffffffffffaf0;
  fdb_kvs_handle *in_stack_fffffffffffffaf8;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char kv_name [8];
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_status status;
  fdb_kvs_info info;
  fdb_doc **doc;
  fdb_kvs_handle **db;
  fdb_file_handle *dbfile;
  int num_kvs;
  int n;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  bool multi_kv_local;
  
  local_5d8[3] = (fdb_kvs_handle *)0x11bbf0;
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  local_5d8[3] = (fdb_kvs_handle *)0x11bbfd;
  memleak_start();
  dbfile._0_4_ = 4;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.chunksize = 0;
  fconfig._2_2_ = 0;
  fconfig.blocksize = 0;
  fconfig.buffercache_size = 0x400;
  fconfig.purging_interval = 1;
  fconfig.flags._3_1_ = 0;
  fconfig.compactor_sleep_duration._0_1_ = multi_kv;
  fdb_open((fdb_file_handle **)fconfig.num_compactor_threads,(char *)fconfig.max_writer_lock_prob,
           (fdb_config *)fconfig.compaction_cb_ctx);
  if (multi_kv) {
    for (num_kvs = 0; num_kvs < 4; num_kvs = num_kvs + 1) {
      sprintf((char *)&fconfig.num_blocks_readahead,"kv%d",(ulong)(uint)num_kvs);
      fdb_kvs_open((fdb_file_handle *)fconfig.buffercache_size,(fdb_kvs_handle **)fconfig._0_8_,
                   (char *)kvs_config.custom_cmp_param,(fdb_kvs_config *)kvs_config.custom_cmp);
    }
  }
  else {
    dbfile._0_4_ = 1;
    fdb_kvs_open_default
              (in_stack_fffffffffffff990,(fdb_kvs_handle **)in_stack_fffffffffffff988,
               (fdb_kvs_config *)0x11bd33);
  }
  num_kvs = 0;
  do {
    if ((int)dbfile <= num_kvs) {
      for (n = 0; n < 5; n = n + 1) {
        sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
        sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)n);
        sprintf(kv_name,"body%d",(ulong)(uint)n);
        in_stack_fffffffffffffaf0 = (fdb_kvs_info *)(metabuf + 0xf8);
        in_stack_fffffffffffffaf8 = (fdb_kvs_handle *)strlen(metabuf + 0xf8);
        strlen(bodybuf + 0xf8);
        pvVar4 = (void *)0x11bec6;
        sVar2 = strlen(kv_name);
        fdb_doc_create(in_stack_fffffffffffff998,in_stack_fffffffffffff990,
                       (size_t)in_stack_fffffffffffff988,pvVar4,sVar2,(void *)0x11befd,
                       in_stack_fffffffffffff9b0);
        for (num_kvs = 0; num_kvs < (int)dbfile; num_kvs = num_kvs + 1) {
          fdb_set(local_5d8[num_kvs],*(fdb_doc **)(&stack0xfffffffffffff988 + (long)n * 8));
        }
      }
      fdb_commit((fdb_file_handle *)in_stack_fffffffffffff988,'\0');
      for (; n < 10; n = n + 1) {
        sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
        sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)n);
        sprintf(kv_name,"body%d",(ulong)(uint)n);
        in_stack_fffffffffffffab0 = &stack0xfffffffffffff988 + (long)n * 8;
        in_stack_fffffffffffffab8 = (fdb_kvs_handle **)(metabuf + 0xf8);
        strlen(metabuf + 0xf8);
        strlen(bodybuf + 0xf8);
        pvVar4 = (void *)0x11c03a;
        sVar2 = strlen(kv_name);
        fdb_doc_create(in_stack_fffffffffffff998,in_stack_fffffffffffff990,
                       (size_t)in_stack_fffffffffffff988,pvVar4,sVar2,(void *)0x11c071,
                       in_stack_fffffffffffff9b0);
        for (num_kvs = 0; num_kvs < (int)dbfile; num_kvs = num_kvs + 1) {
          fdb_set(local_5d8[num_kvs],*(fdb_doc **)(&stack0xfffffffffffff988 + (long)n * 8));
        }
      }
      fdb_commit((fdb_file_handle *)in_stack_fffffffffffff988,'\0');
      for (; local_554 = n, n < 0xf; n = n + 1) {
        sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
        sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)n);
        sprintf(kv_name,"body%d",(ulong)(uint)n);
        local_588 = &stack0xfffffffffffff988 + (long)n * 8;
        local_580 = metabuf + 0xf8;
        local_578 = strlen(metabuf + 0xf8);
        local_570 = bodybuf + 0xf8;
        local_568 = strlen(bodybuf + 0xf8);
        local_560 = kv_name;
        pvVar4 = (void *)0x11c1ba;
        sVar2 = strlen(kv_name);
        fdb_doc_create(in_stack_fffffffffffff998,in_stack_fffffffffffff990,
                       (size_t)in_stack_fffffffffffff988,pvVar4,sVar2,(void *)0x11c1f1,
                       in_stack_fffffffffffff9b0);
        for (num_kvs = 0; num_kvs < (int)dbfile; num_kvs = num_kvs + 1) {
          fdb_set(local_5d8[num_kvs],*(fdb_doc **)(&stack0xfffffffffffff988 + (long)n * 8));
        }
      }
      fdb_commit((fdb_file_handle *)in_stack_fffffffffffff988,'\0');
      for (; n < 0x14; n = n + 1) {
        sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
        sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)n);
        sprintf(kv_name,"body%d",(ulong)(uint)n);
        local_5d8[4] = (fdb_kvs_handle *)(&stack0xfffffffffffff988 + (long)n * 8);
        local_5b0 = metabuf + 0xf8;
        local_5a8 = strlen(metabuf + 0xf8);
        local_5a0 = bodybuf + 0xf8;
        local_598 = strlen(bodybuf + 0xf8);
        local_590 = kv_name;
        pvVar4 = (void *)0x11c316;
        sVar2 = strlen(kv_name);
        fdb_doc_create(in_stack_fffffffffffff998,in_stack_fffffffffffff990,
                       (size_t)in_stack_fffffffffffff988,pvVar4,sVar2,(void *)0x11c34d,
                       in_stack_fffffffffffff9b0);
        for (num_kvs = 0; num_kvs < (int)dbfile; num_kvs = num_kvs + 1) {
          fdb_set(local_5d8[num_kvs],*(fdb_doc **)(&stack0xfffffffffffff988 + (long)n * 8));
        }
      }
      fdb_commit((fdb_file_handle *)in_stack_fffffffffffff988,'\0');
      if (multi_kv) {
        for (num_kvs = 0; num_kvs < (int)dbfile; num_kvs = num_kvs + 1) {
          fVar1 = fdb_rollback(in_stack_fffffffffffffab8,(fdb_seqnum_t)in_stack_fffffffffffffab0);
          if (fVar1 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x1074);
            rollback_to_zero_test::__test_pass = 0;
            if (fVar1 != FDB_RESULT_SUCCESS) {
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0x1074,"void rollback_to_zero_test(bool)");
            }
          }
          fVar1 = fdb_get_kvs_info(in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
          if (fVar1 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x1076);
            rollback_to_zero_test::__test_pass = 0;
            if (fVar1 != FDB_RESULT_SUCCESS) {
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0x1076,"void rollback_to_zero_test(bool)");
            }
          }
          if (info.name != (char *)0x0) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x1077);
            rollback_to_zero_test::__test_pass = 0;
            if (info.name != (char *)0x0) {
              __assert_fail("info.last_seqnum == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0x1077,"void rollback_to_zero_test(bool)");
            }
          }
          if (info.last_seqnum != 0) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x1078);
            rollback_to_zero_test::__test_pass = 0;
            if (info.last_seqnum != 0) {
              __assert_fail("info.doc_count == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0x1078,"void rollback_to_zero_test(bool)");
            }
          }
          if (info.deleted_count != 0) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x1079);
            rollback_to_zero_test::__test_pass = 0;
            if (info.deleted_count != 0) {
              __assert_fail("info.space_used == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0x1079,"void rollback_to_zero_test(bool)");
            }
          }
          fVar1 = fdb_get(local_5d8[num_kvs],in_stack_fffffffffffff988);
          if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x107b);
            rollback_to_zero_test::__test_pass = 0;
            if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
              __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0x107b,"void rollback_to_zero_test(bool)");
            }
          }
          fVar1 = fdb_set(local_5d8[num_kvs],in_stack_fffffffffffff988);
          if (fVar1 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x107e);
            rollback_to_zero_test::__test_pass = 0;
            if (fVar1 != FDB_RESULT_SUCCESS) {
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0x107e,"void rollback_to_zero_test(bool)");
            }
          }
        }
      }
      else {
        fVar1 = fdb_rollback(in_stack_fffffffffffffab8,(fdb_seqnum_t)in_stack_fffffffffffffab0);
        if (fVar1 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x1067);
          rollback_to_zero_test::__test_pass = 0;
          if (fVar1 != FDB_RESULT_SUCCESS) {
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0x1067,"void rollback_to_zero_test(bool)");
          }
        }
        fVar1 = fdb_get_kvs_info(in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
        if (fVar1 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x1069);
          rollback_to_zero_test::__test_pass = 0;
          if (fVar1 != FDB_RESULT_SUCCESS) {
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0x1069,"void rollback_to_zero_test(bool)");
          }
        }
        if (info.name != (char *)0x0) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x106a);
          rollback_to_zero_test::__test_pass = 0;
          if (info.name != (char *)0x0) {
            __assert_fail("info.last_seqnum == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0x106a,"void rollback_to_zero_test(bool)");
          }
        }
        if (info.last_seqnum != 0) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x106b);
          rollback_to_zero_test::__test_pass = 0;
          if (info.last_seqnum != 0) {
            __assert_fail("info.doc_count == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0x106b,"void rollback_to_zero_test(bool)");
          }
        }
        if (info.deleted_count != 0) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x106c);
          rollback_to_zero_test::__test_pass = 0;
          if (info.deleted_count != 0) {
            __assert_fail("info.space_used == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0x106c,"void rollback_to_zero_test(bool)");
          }
        }
        fVar1 = fdb_get(local_5d8[0],in_stack_fffffffffffff988);
        if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x106e);
          rollback_to_zero_test::__test_pass = 0;
          if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
            __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0x106e,"void rollback_to_zero_test(bool)");
          }
        }
        fVar1 = fdb_set(local_5d8[0],in_stack_fffffffffffff988);
        if (fVar1 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x1070);
          rollback_to_zero_test::__test_pass = 0;
          if (fVar1 != FDB_RESULT_SUCCESS) {
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0x1070,"void rollback_to_zero_test(bool)");
          }
        }
      }
      fVar1 = fdb_commit((fdb_file_handle *)in_stack_fffffffffffff988,'\0');
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x1084);
        rollback_to_zero_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x1084,"void rollback_to_zero_test(bool)");
        }
      }
      fdb_close((fdb_file_handle *)in_stack_fffffffffffff988);
      for (n = 0; n < 0x14; n = n + 1) {
        fdb_doc_free((fdb_doc *)0x11cad5);
      }
      fdb_shutdown();
      memleak_end();
      pcVar3 = "single kv mode:";
      if (multi_kv) {
        pcVar3 = "multiple kv mode:";
      }
      sprintf(kv_name,"rollback to zero test %s",pcVar3);
      if (rollback_to_zero_test::__test_pass == 0) {
        fprintf(_stderr,"%s FAILED\n",kv_name);
      }
      else {
        fprintf(_stderr,"%s PASSED\n",kv_name);
      }
      return;
    }
    fVar1 = fdb_set_log_callback(local_5d8[num_kvs],logCallbackFunc,"rollback_to_zero_test");
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x1027);
      rollback_to_zero_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x1027,"void rollback_to_zero_test(bool)");
      }
    }
    num_kvs = num_kvs + 1;
  } while( true );
}

Assistant:

void rollback_to_zero_test(bool multi_kv)
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 20;
    int num_kvs = 4; // keep this the same as number of fdb_commit() calls
    fdb_file_handle *dbfile;
    fdb_kvs_handle **db = alca(fdb_kvs_handle *, num_kvs);
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_kvs_info info;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];
    char kv_name[8];

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.multi_kv_instances = multi_kv;

    // open db
    fdb_open(&dbfile, "./mvcc_test1", &fconfig);

    if (multi_kv) {
        for (r = 0; r < num_kvs; ++r) {
            sprintf(kv_name, "kv%d", r);
            fdb_kvs_open(dbfile, &db[r], kv_name, &kvs_config);
        }
    } else {
        num_kvs = 1;
        fdb_kvs_open_default(dbfile, &db[0], &kvs_config);
    }

    for (r = 0; r < num_kvs; ++r) {
        status = fdb_set_log_callback(db[r], logCallbackFunc,
                                      (void *) "rollback_to_zero_test");
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

   // ------- Setup test ----------------------------------
   // insert documents of 0-4
    for (i=0; i<n/4; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }

    // commit with a manual WAL flush (these docs go into HB-trie)
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents from 5 - 9
    for (; i < n/2; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }

    // commit again without a WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // insert documents from 10-14 into HB-trie
    for (; i < (n/2 + n/4); i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }
    // manually flush WAL & commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents from 15 - 19 on file into the WAL
    for (; i < n; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }
    // commit without a WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    if (!multi_kv) {
        status = fdb_rollback(&db[0], 0);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_get_kvs_info(db[0], &info);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(info.last_seqnum == 0);
        TEST_CHK(info.doc_count == 0);
        TEST_CHK(info.space_used == 0);
        status = fdb_get(db[0], doc[0]);
        TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        status = fdb_set(db[0], doc[0]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    } else {
        for (r = 0; r < num_kvs; ++r) {
            status = fdb_rollback(&db[r], 0);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            status = fdb_get_kvs_info(db[r], &info);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CHK(info.last_seqnum == 0);
            TEST_CHK(info.doc_count == 0);
            TEST_CHK(info.space_used == 0);
            status = fdb_get(db[r], doc[0]);
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
            // test normal operation after rollback
            status = fdb_set(db[r], doc[0]);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }

    // test normal operation after rollbacks manually flush WAL & commit
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close db file
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    sprintf(bodybuf, "rollback to zero test %s", multi_kv ? "multiple kv mode:"
                                                          : "single kv mode:");
    TEST_RESULT(bodybuf);
}